

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yy_char(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *cclass;
  char *cclass_00;
  char *cclass_01;
  char *cclass_02;
  char *cclass_03;
  char *cclass_04;
  
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  iVar2 = yymatchChar(G,0x5c);
  if ((iVar2 != 0) && (iVar2 = yymatchClass(G,(uchar *)"",cclass), iVar2 != 0)) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar1;
  iVar2 = yymatchChar(G,0x5c);
  if ((((iVar2 != 0) && (iVar2 = yymatchClass(G,(uchar *)"",cclass_00), iVar2 != 0)) &&
      (iVar2 = yymatchClass(G,(uchar *)"",cclass_01), iVar2 != 0)) &&
     (iVar2 = yymatchClass(G,(uchar *)"",cclass_02), iVar2 != 0)) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar1;
  iVar2 = yymatchChar(G,0x5c);
  if ((iVar2 != 0) && (iVar2 = yymatchClass(G,(uchar *)"",cclass_03), iVar2 != 0)) {
    iVar3 = G->pos;
    iVar1 = G->thunkpos;
    iVar2 = yymatchClass(G,(uchar *)"",cclass_04);
    if (iVar2 != 0) {
      return 1;
    }
    G->pos = iVar3;
    G->thunkpos = iVar1;
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar1;
  iVar2 = yymatchChar(G,0x5c);
  if (iVar2 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar1;
    if (G->limit <= iVar3) {
      iVar2 = yyrefill(G);
      if (iVar2 == 0) goto LAB_00103fe4;
      iVar3 = G->pos;
    }
    G->pos = iVar3 + 1;
    iVar3 = 1;
  }
  else {
LAB_00103fe4:
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

YY_RULE(int) yy_char(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "char"));

  {  int yypos24= G->pos, yythunkpos24= G->thunkpos;  if (!yymatchChar(G, '\\')) goto l25;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\204\000\000\000\000\000\000\070\146\100\124\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "abefnrtv'\"\\[\\]\\\\")) goto l25;
  goto l24;
  l25:;	  G->pos= yypos24; G->thunkpos= yythunkpos24;  if (!yymatchChar(G, '\\')) goto l26;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\017\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-3")) goto l26;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l26;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l26;
  goto l24;
  l26:;	  G->pos= yypos24; G->thunkpos= yythunkpos24;  if (!yymatchChar(G, '\\')) goto l27;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l27;

  {  int yypos28= G->pos, yythunkpos28= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l28;
  goto l29;
  l28:;	  G->pos= yypos28; G->thunkpos= yythunkpos28;
  }
  l29:;	  goto l24;
  l27:;	  G->pos= yypos24; G->thunkpos= yythunkpos24;
  {  int yypos30= G->pos, yythunkpos30= G->thunkpos;  if (!yymatchChar(G, '\\')) goto l30;
  goto l23;
  l30:;	  G->pos= yypos30; G->thunkpos= yythunkpos30;
  }  if (!yymatchDot(G)) goto l23;
  }
  l24:;	  yyprintf((stderr, "  ok   char"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l23:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "char"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}